

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesDispatch2<true,false>
          (BeagleCPU4StateSSEImpl<double,2,0> *this,double *outDerivatives,double *outSumDerivatives
          ,double *outSumSquaredDerivatives)

{
  if (outSumSquaredDerivatives == (double *)0x0) {
    accumulateDerivativesImpl<true,false,false>(this,outDerivatives,outSumDerivatives,(double *)0x0)
    ;
    return;
  }
  accumulateDerivativesImpl<true,false,true>
            (this,outDerivatives,outSumDerivatives,outSumSquaredDerivatives);
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}